

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

bool __thiscall
ON_OutlineFigure::IsInsideOf
          (ON_OutlineFigure *this,ON_OutlineFigure *outer_figure,bool bPerformExtraChecking)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ON_2dPoint *pOVar5;
  Orientation OVar6;
  bool bVar7;
  Orientation OVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint i;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_1a8;
  double local_1a0;
  double local_198;
  ON_2dPoint local_188;
  ON_2dPoint local_178;
  double local_160;
  double local_158;
  ON_2dPoint *local_150;
  double local_148;
  ON_SimpleArray<ON_2dPoint> outer_pline;
  ON_SimpleArray<ON_2dPoint> inner_pline;
  ON_2dPoint local_e8;
  ON_2dPoint local_d8;
  double local_c8;
  undefined8 uStack_c0;
  ON_2fPoint this_p [4];
  ON_BoundingBox outer_bbox;
  ON_BoundingBox this_bbox;
  
  if ((outer_figure != (ON_OutlineFigure *)0x0) &&
     (OVar6 = FigureOrientation(outer_figure), 0xfd < (byte)(OVar6 - NotOriented))) {
    BoundingBox(&this_bbox,this);
    BoundingBox(&outer_bbox,outer_figure);
    bVar7 = ON_BoundingBox::Includes(&outer_bbox,&this_bbox,false);
    if (bVar7) {
      dVar3 = AreaEstimate(outer_figure);
      dVar21 = AreaEstimate(this);
      if ((dVar21 != 0.0) && (ABS(dVar21) < ABS(dVar3))) {
        uVar9 = GetUpToFourPointsOnFigure(this,this_p);
        uVar13 = 0;
        do {
          if (uVar9 == uVar13) {
            if ((ulong)uVar9 == 0) {
              return false;
            }
            OVar8 = FigureOrientation(this);
            if (OVar6 != OVar8 && !bPerformExtraChecking) {
              return true;
            }
            outer_pline._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081d290;
            outer_pline.m_a = (ON_2dPoint *)0x0;
            outer_pline.m_count = 0;
            outer_pline.m_capacity = 0;
            GetPolyline(outer_figure,0.0,&outer_pline);
            uVar13 = outer_pline._16_8_ & 0xffffffff;
            if (3 < uVar13) {
              inner_pline._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081d290;
              inner_pline.m_a = (ON_2dPoint *)0x0;
              inner_pline.m_count = 0;
              inner_pline.m_capacity = 0;
              GetPolyline(this,0.0,&inner_pline);
              pOVar5 = inner_pline.m_a;
              dVar3 = ON_DBL_QNAN;
              if (1 < (inner_pline._16_8_ & 0xffffffff)) {
                local_150 = outer_pline.m_a;
                local_1a8 = (inner_pline.m_a)->x;
                dVar21 = (inner_pline.m_a)->y;
                lVar12 = (inner_pline._16_8_ & 0xffffffff) << 4;
                local_1a0 = dVar21;
                local_198 = local_1a8;
                for (lVar11 = 0x10; lVar12 != lVar11; lVar11 = lVar11 + 0x10) {
                  dVar2 = *(double *)((long)&(inner_pline.m_a)->x + lVar11);
                  dVar18 = dVar2;
                  if ((local_198 <= dVar2) && (dVar18 = local_198, local_1a8 < dVar2)) {
                    local_1a8 = dVar2;
                  }
                  local_198 = dVar18;
                  dVar2 = *(double *)((long)&(inner_pline.m_a)->y + lVar11);
                  uVar16 = SUB84(dVar2,0);
                  uVar17 = (undefined4)((ulong)dVar2 >> 0x20);
                  dVar18 = dVar2;
                  if ((dVar2 < local_1a0) || (dVar18 = local_1a0, dVar2 <= dVar21)) {
                    local_1a0 = dVar18;
                    uVar16 = SUB84(dVar21,0);
                    uVar17 = (undefined4)((ulong)dVar21 >> 0x20);
                  }
                  dVar21 = (double)CONCAT44(uVar17,uVar16);
                }
                local_178.x = (outer_pline.m_a)->x;
                local_178.y = (outer_pline.m_a)->y;
                local_e8.x = ON_2dPoint::NanPoint.x;
                local_e8.y = ON_2dPoint::NanPoint.y;
                local_d8.x = ON_2dPoint::NanPoint.x;
                local_d8.y = ON_2dPoint::NanPoint.y;
                local_160 = ON_DBL_QNAN;
                local_158 = ON_DBL_QNAN;
                for (uVar14 = 1; uVar15 = uVar13, uVar14 != uVar13; uVar14 = uVar14 + 1) {
                  local_188.x = local_178.x;
                  local_188.y = local_178.y;
                  local_178.x = local_150[uVar14].x;
                  local_178.y = local_150[uVar14].y;
                  bVar7 = ON_2dPoint::operator==(&local_188,&local_178);
                  if (!bVar7) {
                    local_148 = local_188.x;
                    if (local_188.x <= local_178.x) {
                      local_148 = local_178.x;
                    }
                    if ((local_198 <= local_148) &&
                       (dVar2 = (double)(~-(ulong)(local_178.x < local_188.x) & (ulong)local_188.x |
                                        (ulong)local_178.x & -(ulong)(local_178.x < local_188.x)),
                       dVar2 <= local_1a8)) {
                      dVar18 = local_188.y;
                      if (local_188.y <= local_178.y) {
                        dVar18 = local_178.y;
                      }
                      if ((local_1a0 <= dVar18) &&
                         (dVar19 = (double)(~-(ulong)(local_178.y < local_188.y) &
                                            (ulong)local_188.y |
                                           (ulong)local_178.y & -(ulong)(local_178.y < local_188.y))
                         , dVar19 <= dVar21)) {
                        uStack_c0 = 0;
                        local_d8.x = pOVar5->x;
                        local_d8.y = pOVar5->y;
                        dVar22 = dVar3;
                        local_c8 = dVar19;
                        for (lVar11 = 0x10; lVar12 != lVar11; lVar11 = lVar11 + 0x10) {
                          local_e8.x = local_d8.x;
                          local_e8.y = local_d8.y;
                          pdVar1 = (double *)((long)&pOVar5->x + lVar11);
                          local_d8.x = *pdVar1;
                          local_d8.y = pdVar1[1];
                          bVar7 = ON_2dPoint::operator==(&local_e8,&local_d8);
                          if ((((!bVar7) && ((dVar2 <= local_e8.x || (dVar2 <= local_d8.x)))) &&
                              ((local_c8 <= local_e8.y || (local_c8 <= local_d8.y)))) &&
                             (((local_e8.x <= local_148 || (local_d8.x <= local_148)) &&
                              ((local_e8.y <= dVar18 || (local_d8.y <= dVar18)))))) {
                            if (NAN(dVar22)) {
                              dVar22 = local_178.y - local_188.y;
                              local_158 = local_188.x - local_178.x;
                              local_160 = local_178.x * local_188.y - local_178.y * local_188.x;
                            }
                            dVar19 = dVar22 * local_e8.x + local_e8.y * local_158 + local_160;
                            dVar20 = dVar22 * local_d8.x + local_d8.y * local_158 + local_160;
                            if (((0.0 <= dVar19) || (0.0 <= dVar20)) &&
                               ((dVar19 <= 0.0 || (dVar20 <= 0.0)))) {
                              dVar19 = local_d8.x * local_e8.y + local_d8.y * -local_e8.x;
                              dVar20 = (local_d8.y - local_e8.y) * local_e8.x +
                                       (local_e8.x - local_d8.x) * local_e8.y + dVar19;
                              dVar19 = dVar19 + local_d8.x * (local_d8.y - local_e8.y) +
                                                local_d8.y * (local_e8.x - local_d8.x);
                              if (((0.0 <= dVar20) || (0.0 <= dVar19)) &&
                                 ((uVar15 = uVar14, dVar20 <= 0.0 || (dVar19 <= 0.0))))
                              goto LAB_004ad4e8;
                            }
                          }
                        }
                      }
                    }
                  }
                }
LAB_004ad4e8:
                ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&inner_pline);
                ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&outer_pline);
                if (uVar13 <= uVar15) {
                  return true;
                }
                return false;
              }
              ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&inner_pline);
            }
            ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&outer_pline);
            return false;
          }
          iVar10 = WindingNumber(outer_figure,this_p[uVar13]);
          iVar4 = -iVar10;
          if (OVar6 == CounterClockwise) {
            iVar4 = iVar10;
          }
          uVar13 = uVar13 + 1;
        } while (iVar4 == 1);
      }
    }
  }
  return false;
}

Assistant:

bool ON_OutlineFigure::IsInsideOf(
  const ON_OutlineFigure* outer_figure,
  bool bPerformExtraChecking
) const
{
  if (nullptr == outer_figure)
    return false;

  const ON_OutlineFigure::Orientation outer_orientation = outer_figure->FigureOrientation();
  if (ON_OutlineFigure::Orientation::Clockwise != outer_orientation && ON_OutlineFigure::Orientation::CounterClockwise != outer_orientation)
    return false;


  const ON_BoundingBox this_bbox = this->BoundingBox();
  const ON_BoundingBox outer_bbox = outer_figure->BoundingBox();
  if (false == outer_bbox.Includes(this_bbox))
  {
    // The bounding boxes are from the glyph outline control polygons.
    // There are rare case when this f is inside of other_f
    // but this_bbox is not contained in other_bbox. In practice, this
    // is quite rare, but that's why "probably" is part of this function's name.
    return false;
  }

  const double outer_area = fabs(outer_figure->AreaEstimate());
  const double this_area = fabs(this->AreaEstimate());
  if (false == (0.0 < this_area && this_area < outer_area))
    return false; // this figure is too big to be inside of other_f

  // Check that the 3 standard test points on this are inside of other_f.
  // Again, it is possible that the 3 test points are inside but some other
  // point is outside. In practice this is rare and that possibility
  // is why "probably" is in this function's name.

  const int outer_orientation_sign = ON_OutlineFigure::Orientation::CounterClockwise == outer_orientation ? 1 : -1;

  ON_2fPoint this_p[4];
  unsigned  this_point_count = this->GetUpToFourPointsOnFigure(this_p);

  for (unsigned i = 0; i < this_point_count; ++i)
  {
    // check start point.
    const int wn = outer_orientation_sign * outer_figure->WindingNumber(this_p[i]);
    if (1 != wn)
    {
      // this_p[i] is not inside of other_f.
      return false;
    }
  }

  if (0 == this_point_count)
    return false;

  const ON_OutlineFigure::Orientation this_orientation = this->FigureOrientation();

  if (outer_orientation == this_orientation || bPerformExtraChecking)
  {
    // The context that calls this function is sorting nested loops.
    // The orientation of outer_figure has been decided and set at this point.
    // When this orientation of this is not different, we need more checking
    // to verify that the orientation from the font definition file was really "wrong".
    // The "A crossbar" in Bahnschrift U+00C5 is one of many cases that
    // require this additional checking. More generally, glyphs with
    // orientations set correctly and which use overlapping outer 
    // boundaries need this test to prevent incorrectly. This situation is
    // common in fonts like Bahnschrift and fonts for Asian language scripts
    // that have "brush stroke" boundaries that overlap.
    if (false == Internal_ExtraInsideOfPolylineText(outer_figure, this))
      return false;
  }

  return true;
}